

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineinput.cpp
# Opt level: O2

int __thiscall CLineInput::OffsetFromDisplayToActual(CLineInput *this,int DisplayOffset)

{
  int iVar1;
  int PrevOffset;
  int iVar2;
  
  if (this->m_Hidden == true) {
    if (DisplayOffset < 1) {
      DisplayOffset = 0;
    }
    iVar2 = DisplayOffset + 1;
    iVar1 = 0;
    do {
      DisplayOffset = iVar1;
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return DisplayOffset;
      }
      iVar1 = str_utf8_forward(this->m_pStr,DisplayOffset);
    } while (iVar1 != DisplayOffset);
  }
  return DisplayOffset;
}

Assistant:

int CLineInput::OffsetFromDisplayToActual(int DisplayOffset) const
{
	if(!IsHidden())
		return DisplayOffset;
	int ActualOffset = 0;
	for(int i = 0; i < DisplayOffset; i++)
	{
		const int PrevOffset = ActualOffset;
		ActualOffset = str_utf8_forward(m_pStr, ActualOffset);
		if(ActualOffset == PrevOffset)
			break;
	}
	return ActualOffset;
}